

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O0

void so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>
     ::send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long_const&>
               (mbox_t *to,prefix_t *args,suffix_t *args_1,unsigned_long *args_2)

{
  message_mutability_t mutability;
  abstract_message_box_t *this;
  unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
  local_38;
  type_index local_30;
  unsigned_long *local_28;
  unsigned_long *args_local_2;
  suffix_t *args_local_1;
  prefix_t *args_local;
  mbox_t *to_local;
  
  local_28 = args_2;
  args_local_2 = (unsigned_long *)args_1;
  args_local_1 = (suffix_t *)args;
  args_local = (prefix_t *)to;
  this = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(to);
  local_30 = message_payload_type_impl<so_5::stats::messages::quantity<unsigned_long>,_true>::
             subscription_type_index();
  details::
  make_message_instance<so_5::stats::messages::quantity<unsigned_long>,so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long_const&>
            ((details *)&local_38,(prefix_t *)args_local_1,(suffix_t *)args_local_2,local_28);
  mutability = message_payload_type_impl<so_5::stats::messages::quantity<unsigned_long>,_true>::
               mutability();
  abstract_message_box_t::deliver_message<so_5::stats::messages::quantity<unsigned_long>>
            (this,local_30,&local_38,mutability);
  std::
  unique_ptr<so_5::stats::messages::quantity<unsigned_long>,_std::default_delete<so_5::stats::messages::quantity<unsigned_long>_>_>
  ::~unique_ptr(&local_38);
  return;
}

Assistant:

static void
			send(
				const so_5::mbox_t & to,
				ARGS &&... args )
				{
					to->deliver_message(
						message_payload_type< MESSAGE >::subscription_type_index(),
						so_5::details::make_message_instance< MESSAGE >(
								std::forward< ARGS >( args )...),
						message_payload_type< MESSAGE >::mutability() );
				}